

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_extension.cpp
# Opt level: O0

void duckdb::GetEnvFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  reference result_00;
  anon_class_8_1_6971b95b in_RDX;
  DataChunk *in_RDI;
  idx_t in_stack_ffffffffffffffc8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffd0;
  anon_class_8_1_6971b95b input;
  
  result_00 = vector<duckdb::Vector,_true>::operator[]
                        (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  input.result = in_RDX.result;
  DataChunk::size(in_RDI);
  UnaryExecutor::
  Execute<duckdb::string_t,duckdb::string_t,duckdb::GetEnvFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0>
            (input.result,result_00,in_stack_ffffffffffffffc8,in_RDX,CANNOT_ERROR);
  return;
}

Assistant:

void GetEnvFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	UnaryExecutor::Execute<string_t, string_t>(args.data[0], result, args.size(), [&](string_t input) {
		string env_name = input.GetString();
		auto env_value = getenv(env_name.c_str());
		if (!env_value) {
			return StringVector::AddString(result, string());
		}
		return StringVector::AddString(result, env_value);
	});
}